

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_basic.c
# Opt level: O0

void on_evict_test_evict_cb(VMEMcache *cache,void *key,size_t key_size,void *arg)

{
  long lVar1;
  ssize_t ret;
  ctx_cb *ctx;
  void *arg_local;
  size_t key_size_local;
  void *key_local;
  VMEMcache *cache_local;
  
  *(long *)((long)arg + 0x118) = *(long *)((long)arg + 0x118) + 1;
  lVar1 = vmemcache_get(cache,key,key_size,arg,*(undefined8 *)((long)arg + 0x100),0,
                        (long)arg + 0x108);
  if (lVar1 < 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0x1aa,"on_evict_test_evict_cb");
    fprintf(_stderr,"vmemcache_get");
    fprintf(_stderr,"\n");
    abort();
  }
  if (lVar1 != 0x100) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0x1af,"on_evict_test_evict_cb");
    fprintf(_stderr,"vmemcache_get: wrong return value: %zi (should be %i)",lVar1,0x100);
    fprintf(_stderr,"\n");
    abort();
  }
  return;
}

Assistant:

static void
on_evict_test_evict_cb(VMEMcache *cache, const void *key, size_t key_size,
		void *arg)
{
	struct ctx_cb *ctx = arg;
	ssize_t ret;

	ctx->evict_count++;

	ret = vmemcache_get(cache, key, key_size, ctx->vbuf, ctx->vbufsize, 0,
				&ctx->vsize);
	if (ret < 0)
		UT_FATAL("vmemcache_get");

	if ((size_t)ret != VSIZE)
		UT_FATAL(
			"vmemcache_get: wrong return value: %zi (should be %i)",
			ret, VSIZE);
}